

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O1

char * mpp_get_platform_dev_name(MppCtxType type,MppCodingType coding,RK_U32 platform)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  long lVar4;
  
  if (type == MPP_CTX_DEC && (platform >> 9 & 1) != 0) {
    if ((int)coding < 0x1000004) {
      if ((coding == MPP_VIDEO_CodingAVC) || (coding == MPP_VIDEO_CodingVP9)) {
LAB_00176af5:
        ppcVar3 = mpp_rkvdec_dev;
        lVar4 = 0;
        while (iVar1 = access(*(char **)((long)mpp_rkvdec_dev + lVar4),0), iVar1 != 0) {
          lVar4 = lVar4 + 8;
          if (lVar4 == 0x10) {
            return (char *)0x0;
          }
        }
LAB_00176c82:
        return *(char **)((long)ppcVar3 + lVar4);
      }
    }
    else if ((coding == MPP_VIDEO_CodingAVS2) || (coding == MPP_VIDEO_CodingHEVC))
    goto LAB_00176af5;
  }
  if (((coding == MPP_VIDEO_CodingHEVC) && (type == MPP_CTX_DEC)) && ((platform & 0x100) != 0)) {
    pcVar2 = (char *)0x0;
    ppcVar3 = mpp_hevc_dev;
    lVar4 = 0;
    do {
      iVar1 = access(*(char **)((long)mpp_hevc_dev + lVar4),0);
      if (iVar1 == 0) goto LAB_00176c82;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
  }
  else if (((type == MPP_CTX_DEC) && (coding == MPP_VIDEO_CodingAVS)) && ((platform & 0x1000) != 0))
  {
    pcVar2 = (char *)0x0;
    ppcVar3 = mpp_avsd_dev;
    lVar4 = 0;
    do {
      iVar1 = access(*(char **)((long)mpp_avsd_dev + lVar4),0);
      if (iVar1 == 0) goto LAB_00176c82;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x10);
  }
  else if (((type == MPP_CTX_ENC) && (coding == MPP_VIDEO_CodingAVC)) && ((platform & 0x10000) != 0)
          ) {
    pcVar2 = (char *)0x0;
    ppcVar3 = mpp_rkvenc_dev;
    lVar4 = 0;
    do {
      iVar1 = access(*(char **)((long)mpp_rkvenc_dev + lVar4),0);
      if (iVar1 == 0) goto LAB_00176c82;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x10);
  }
  else if (((coding == MPP_VIDEO_CodingHEVC) && (type == MPP_CTX_ENC)) &&
          ((platform & 0x1000000) != 0)) {
    pcVar2 = (char *)0x0;
    ppcVar3 = mpp_h265e_dev;
    lVar4 = 0;
    do {
      iVar1 = access(*(char **)((long)mpp_h265e_dev + lVar4),0);
      if (iVar1 == 0) goto LAB_00176c82;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x10);
  }
  else {
    pcVar2 = (char *)0x0;
    if (type == MPP_CTX_ENC) {
      lVar4 = 0;
      do {
        iVar1 = access(*(char **)((long)mpp_vepu_dev + lVar4),0);
        if (iVar1 == 0) {
          pcVar2 = *(char **)((long)mpp_vepu_dev + lVar4);
          break;
        }
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x10);
    }
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)0x0;
      ppcVar3 = mpp_vpu_dev;
      lVar4 = 0;
      do {
        iVar1 = access(*(char **)((long)mpp_vpu_dev + lVar4),0);
        if (iVar1 == 0) goto LAB_00176c82;
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x18);
    }
  }
  return pcVar2;
}

Assistant:

const char *mpp_get_platform_dev_name(MppCtxType type, MppCodingType coding, RK_U32 platform)
{
    const char *dev = NULL;

    if ((platform & HAVE_RKVDEC) && (type == MPP_CTX_DEC) &&
        (coding == MPP_VIDEO_CodingAVC ||
         coding == MPP_VIDEO_CodingHEVC ||
         coding == MPP_VIDEO_CodingAVS2 ||
         coding == MPP_VIDEO_CodingVP9)) {
        dev = mpp_find_device(mpp_rkvdec_dev);
    } else if ((platform & HAVE_HEVC_DEC) && (type == MPP_CTX_DEC) &&
               (coding == MPP_VIDEO_CodingHEVC)) {
        dev = mpp_find_device(mpp_hevc_dev);
    } else if ((platform & HAVE_AVSDEC) && (type == MPP_CTX_DEC) &&
               (coding == MPP_VIDEO_CodingAVS)) {
        dev = mpp_find_device(mpp_avsd_dev);
    } else if ((platform & HAVE_RKVENC) && (type == MPP_CTX_ENC) &&
               (coding == MPP_VIDEO_CodingAVC)) {
        dev = mpp_find_device(mpp_rkvenc_dev);
    } else if ((platform & HAVE_VEPU22) && (type == MPP_CTX_ENC) &&
               (coding == MPP_VIDEO_CodingHEVC)) {
        dev = mpp_find_device(mpp_h265e_dev);
    } else {
        if (type == MPP_CTX_ENC)
            dev = mpp_find_device(mpp_vepu_dev);

        if (dev == NULL)
            dev = mpp_find_device(mpp_vpu_dev);
    }

    return dev;
}